

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlReplaceNode(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_60;
  PyObject *local_58;
  undefined *local_50;
  PyObject *pyobj_cur;
  xmlNodePtr cur;
  PyObject *pyobj_old;
  xmlNodePtr old;
  xmlNodePtr c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"OO:xmlReplaceNode",&cur,&local_50);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (cur == (xmlNodePtr)&_Py_NoneStruct) {
      local_58 = (PyObject *)0x0;
    }
    else {
      local_58 = (PyObject *)cur->name;
    }
    pyobj_old = local_58;
    if (local_50 == &_Py_NoneStruct) {
      local_60 = (PyObject *)0x0;
    }
    else {
      local_60 = *(PyObject **)(local_50 + 0x10);
    }
    pyobj_cur = local_60;
    old = (xmlNodePtr)xmlReplaceNode(local_58,local_60);
    self_local = libxml_xmlNodePtrWrap(old);
  }
  return self_local;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlReplaceNode(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlNodePtr c_retval;
    xmlNodePtr old;
    PyObject *pyobj_old;
    xmlNodePtr cur;
    PyObject *pyobj_cur;

    if (!PyArg_ParseTuple(args, (char *)"OO:xmlReplaceNode", &pyobj_old, &pyobj_cur))
        return(NULL);
    old = (xmlNodePtr) PyxmlNode_Get(pyobj_old);
    cur = (xmlNodePtr) PyxmlNode_Get(pyobj_cur);

    c_retval = xmlReplaceNode(old, cur);
    py_retval = libxml_xmlNodePtrWrap((xmlNodePtr) c_retval);
    return(py_retval);
}